

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_logical_plan.cpp
# Opt level: O1

idx_t duckdb::GetMaxTableIndex(LogicalOperator *op)

{
  pointer puVar1;
  type op_00;
  idx_t iVar2;
  unsigned_long *index;
  ulong *puVar3;
  ulong uVar4;
  ulong uVar5;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *child;
  pointer this;
  vector<unsigned_long,_true> indexes;
  ulong *local_40;
  ulong *local_38;
  
  this = (op->children).
         super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (op->children).
           super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this == puVar1) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    do {
      op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator*(this);
      iVar2 = GetMaxTableIndex(op_00);
      if (iVar2 < uVar5) {
        iVar2 = uVar5;
      }
      uVar5 = iVar2;
      this = this + 1;
    } while (this != puVar1);
  }
  (*op->_vptr_LogicalOperator[0xd])(&local_40,op);
  for (puVar3 = local_40; puVar3 != local_38; puVar3 = puVar3 + 1) {
    uVar4 = *puVar3;
    if (*puVar3 < uVar5) {
      uVar4 = uVar5;
    }
    uVar5 = uVar4;
  }
  if (local_40 != (ulong *)0x0) {
    operator_delete(local_40);
  }
  return uVar5;
}

Assistant:

idx_t GetMaxTableIndex(LogicalOperator &op) {
	idx_t result = 0;
	for (auto &child : op.children) {
		auto max_child_index = GetMaxTableIndex(*child);
		result = MaxValue<idx_t>(result, max_child_index);
	}
	auto indexes = op.GetTableIndex();
	for (auto &index : indexes) {
		result = MaxValue<idx_t>(result, index);
	}
	return result;
}